

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpMap<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
  **this;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  int v2;
  uint uVar5;
  uint uVar6;
  ParseContext *ctx_00;
  UntypedMapBase *pUVar7;
  NodeBase *pNVar8;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
  *pOVar9;
  bool bVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  void *x;
  MapFieldBaseForParse *this_00;
  UntypedMapBase *f;
  ParseContext *node;
  Nonnull<const_char_*> failure_msg;
  ushort *puVar14;
  int *piVar15;
  long lVar16;
  uint7 uVar18;
  ulong uVar17;
  uint *puVar19;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *pPVar20;
  ParseContext *extraout_RDX_01;
  anon_class_24_3_6b4a22af *paVar21;
  anon_class_24_3_6b4a22af *paVar22;
  anon_class_24_3_6b4a22af *paVar23;
  anon_class_24_3_6b4a22af *paVar24;
  anon_class_24_3_6b4a22af *paVar25;
  anon_class_24_3_6b4a22af *paVar26;
  anon_class_24_3_6b4a22af *paVar27;
  anon_class_24_3_6b4a22af *paVar28;
  char *pcVar29;
  ParseContext *msg_00;
  TcParseTableBase *pTVar30;
  int iVar31;
  undefined1 local_c8 [8];
  undefined8 auStack_c0 [2];
  byte local_a9;
  TcParseTableBase *local_a8;
  MessageLite *local_a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_98;
  uint64_t local_90;
  FieldAux *aux;
  ParseContext *local_60;
  FieldEntry *local_58;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_50;
  
  local_a0 = msg;
  local_58 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                       (table,(ulong)data.field_0 >> 0x20);
  aux = (FieldAux *)
        ((long)&table->has_bits_offset + (ulong)local_58->aux_idx * 8 + (ulong)table->aux_offset);
  local_a9 = (byte)(aux->enum_range).last;
  local_a8 = table;
  if (((local_a9 & 1) == 0) || ((data.field_0._0_4_ & 7) != 2)) {
    pcVar29 = MpFallback(local_a0,ptr,ctx,data,table,hasbits);
    return pcVar29;
  }
  uVar4 = *(undefined4 *)
           ((long)&table->has_bits_offset + (ulong)local_58->aux_idx * 8 + (ulong)table->aux_offset)
  ;
  local_90 = hasbits;
  x = MaybeGetSplitBase(local_a0,true,table);
  local_60 = ctx;
  if ((local_a9 & 2) == 0) {
    this_00 = RefAt<google::protobuf::internal::MapFieldBaseForParse>(x,(ulong)local_58->offset);
    f = MapFieldBaseForParse::MutableMap(this_00);
  }
  else {
    f = RefAt<google::protobuf::internal::UntypedMapBase>(x,(ulong)local_58->offset);
  }
  puVar19._4_1_ = local_a9;
  puVar19._0_4_ = uVar4;
  puVar19._5_3_ = 0;
  paVar25 = (anon_class_24_3_6b4a22af *)local_c8;
  local_98 = data.field_0;
  local_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar19;
  do {
    paVar25[-1].node = (NodeBase **)0x1d17ed;
    node = (ParseContext *)UntypedMapBase::AllocNode(f);
    uVar17 = (ulong)(f->type_info_).node_size;
    paVar25[3].f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                    *)(uVar17 - 8);
    paVar25[5].f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                    *)0x8;
    this = &paVar25[5].f;
    paVar25[-1].node = (NodeBase **)0x1d1829;
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<long,unsigned_long>
                            ((long *)&paVar25[3].f,(unsigned_long *)this,
                             "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      pcVar29 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      iVar31 = 0xb2c;
LAB_001d1c0a:
      paVar25[-1].node = (NodeBase **)0x1d1c12;
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&paVar25[3].f,pcVar29,iVar31,failure_msg);
      paVar25[-1].node = (NodeBase **)0x1d1c1a;
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&paVar25[3].f);
    }
    (node->super_EpsCopyInputStream).buffer_end_ = (char *)0x0;
    pcVar29 = (node->super_EpsCopyInputStream).patch_buffer_ + (uVar17 - 0x30);
    pcVar29[0] = '\0';
    pcVar29[1] = '\0';
    pcVar29[2] = '\0';
    pcVar29[3] = '\0';
    pcVar29[4] = '\0';
    pcVar29[5] = '\0';
    pcVar29[6] = '\0';
    pcVar29[7] = '\0';
    paVar25[-1].node = (NodeBase **)0x1d184b;
    pcVar29 = (char *)node;
    UntypedMapBase::
    VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>
              (f,(NodeBase *)node,
               (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                )f);
    paVar25[5].f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                    *)f;
    paVar25[5].node = (NodeBase **)&paVar25[2].node;
    paVar25[6].this = f;
    paVar25[3].this = (UntypedMapBase *)node;
    paVar25[3].f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                    *)f;
    paVar25[3].node = (NodeBase **)this;
    paVar25[4].this = (UntypedMapBase *)(paVar25 + 3);
    paVar25->node = (NodeBase **)(paVar25 + 3);
    pOVar9 = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
              *)paVar25[3].node;
    paVar25->this = (UntypedMapBase *)paVar25[3].f;
    paVar25->f = pOVar9;
    paVar25[-1].node = (NodeBase **)0x1d1897;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              (f,*paVar25);
    paVar25[3].f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                    *)ptr;
    paVar25[-1].node = (NodeBase **)0x1d18a4;
    uVar11 = ReadSize((char **)&paVar25[3].f);
    pPVar20 = (ParseContext *)paVar25[3].f;
    ctx_00 = (ParseContext *)paVar25[4].f;
    if ((pPVar20 == (ParseContext *)0x0) || (ctx_00->depth_ < 1)) {
LAB_001d1b00:
      if (f->arena_ == (Arena *)0x0) {
        paVar25[-1].node = (NodeBase **)0x1d1b12;
        UntypedMapBase::DeleteNode(f,(NodeBase *)node);
        pPVar20 = extraout_RDX_01;
        pcVar29 = (char *)node;
      }
      pcVar29 = Error((MessageLite *)paVar25[1].node,pcVar29,pPVar20,(TcFieldData)puVar19,
                      (TcParseTableBase *)paVar25[1].f,(uint64_t)paVar25[2].f);
      return pcVar29;
    }
    puVar19._4_4_ = 0;
    puVar19._0_4_ = uVar11;
    paVar25[-1].node = (NodeBase **)0x1d18d0;
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)this,(char *)ctx_00,(int)pPVar20);
    uVar4 = *(undefined4 *)&paVar25[5].f;
    iVar31 = ctx_00->depth_ + -1;
    ctx_00->depth_ = iVar31;
    pcVar29 = (char *)paVar25[3].f;
    pPVar20 = extraout_RDX;
    if ((ParseContext *)pcVar29 == (ParseContext *)0x0) goto LAB_001d1b00;
    puVar19 = (uint *)paVar25[2].node;
    paVar25->this = f;
    pTVar30 = (TcParseTableBase *)paVar25[1].f;
    paVar25[-1].node = (NodeBase **)0x1d1911;
    puVar14 = (ushort *)
              ParseOneMapEntry((NodeBase *)node,pcVar29,ctx_00,(FieldAux *)puVar19,pTVar30,
                               (FieldEntry *)paVar25[4].node,paVar25->this);
    if (puVar14 != (ushort *)0x0) {
      v2 = ctx_00->depth_;
      paVar25[-1].node = (NodeBase **)0x1d192d;
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl(iVar31,v2,"old_depth == depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        pcVar29 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
        ;
        iVar31 = 0x481;
        goto LAB_001d1c0a;
      }
    }
    ctx_00->depth_ = ctx_00->depth_ + 1;
    *(undefined4 *)&paVar25[3].this = uVar4;
    pcVar29 = (char *)(paVar25 + 3);
    paVar25[-1].node = (NodeBase **)0x1d194d;
    msg_00 = ctx_00;
    bVar10 = EpsCopyInputStream::PopLimit((EpsCopyInputStream *)ctx_00,(LimitToken *)pcVar29);
    pPVar20 = extraout_RDX_00;
    if ((!bVar10) || (puVar14 == (ushort *)0x0)) goto LAB_001d1b00;
    pUVar7 = paVar25[2].this;
    uVar13 = (uint)pUVar7;
    paVar21 = paVar25;
    if (((ulong)paVar25[1].this & 0x1000000000000000) == 0) {
LAB_001d199b:
      if (5 < (SUB41(f->type_info_,3) & 0xf)) {
switchD_001d19c0_caseD_3:
        *(undefined8 *)((long)paVar25 + -8) = 0x1d1c2b;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0xb68);
      }
      uVar12 = (uint)f->type_info_ >> 0x18 & 0xf;
      puVar19 = &switchD_001d19c0::switchdataD_00270794;
      piVar15 = (int *)((long)&switchD_001d19c0::switchdataD_00270794 +
                       (long)(int)(&switchD_001d19c0::switchdataD_00270794)[uVar12]);
      paVar26 = paVar25;
      paVar27 = paVar25;
      paVar28 = paVar25;
      paVar23 = paVar25;
      paVar22 = paVar25;
      paVar24 = paVar25;
      switch(uVar12) {
      case 0:
switchD_001d19c0_caseD_0:
        *(undefined8 *)((long)paVar21 + -8) = 0x1d19cd;
        KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)f,(KeyNode *)node);
        break;
      case 1:
switchD_001d19c0_caseD_1:
        *(undefined8 *)((long)paVar24 + -8) = 0x1d19f4;
        KeyMapBase<unsigned_int>::InsertOrReplaceNode((KeyMapBase<unsigned_int> *)f,(KeyNode *)node)
        ;
        paVar21 = paVar24;
        break;
      case 2:
switchD_001d19c0_caseD_2:
        *(undefined8 *)((long)paVar22 + -8) = 0x1d19da;
        KeyMapBase<unsigned_long>::InsertOrReplaceNode
                  ((KeyMapBase<unsigned_long> *)f,(KeyNode *)node);
        paVar21 = paVar22;
        break;
      default:
        goto switchD_001d19c0_caseD_3;
      case 5:
switchD_001d19c0_caseD_5:
        *(undefined8 *)((long)paVar23 + -8) = 0x1d19e7;
        KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InsertOrReplaceNode
                  ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)f,(KeyNode *)node);
        paVar21 = paVar23;
        break;
      case 6:
switchD_001d19c0_caseD_6:
        puVar14 = *(ushort **)((long)paVar26 + 8);
        paVar21 = (anon_class_24_3_6b4a22af *)((long)paVar26 + 0x10);
        paVar24 = (anon_class_24_3_6b4a22af *)((long)paVar26 + 0x10);
        paVar22 = (anon_class_24_3_6b4a22af *)((long)paVar26 + 0x10);
        paVar25 = (anon_class_24_3_6b4a22af *)((long)paVar26 + 0x10);
        paVar23 = (anon_class_24_3_6b4a22af *)((long)paVar26 + 0x10);
        paVar28 = (anon_class_24_3_6b4a22af *)((long)paVar26 + 0x10);
        paVar27 = (anon_class_24_3_6b4a22af *)((long)paVar26 + 0x10);
        paVar26 = (anon_class_24_3_6b4a22af *)((long)paVar26 + 0x10);
        switch(uVar12) {
        case 0:
          goto switchD_001d19c0_caseD_0;
        case 1:
          goto switchD_001d19c0_caseD_1;
        case 2:
          goto switchD_001d19c0_caseD_2;
        default:
          goto switchD_001d19c0_caseD_3;
        case 5:
          goto switchD_001d19c0_caseD_5;
        case 6:
          goto switchD_001d19c0_caseD_6;
        case 7:
          goto switchD_001d19c0_caseD_7;
        case 8:
          goto switchD_001d19c0_caseD_8;
        case 9:
          goto switchD_001d19c0_caseD_9;
        case 10:
          goto switchD_001d19c0_caseD_a;
        case 0xb:
          goto switchD_001d19c0_caseD_b;
        case 0xc:
          goto switchD_001d19c0_caseD_c;
        case 0xd:
          goto switchD_001d19c0_caseD_d;
        case 0xe:
          goto switchD_001d19c0_caseD_e;
        case 0xf:
          goto switchD_001d19c0_caseD_f;
        }
      case 7:
switchD_001d19c0_caseD_7:
        pcVar29 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                            ((MessageLite *)msg_00,pcVar29,pPVar20,(TcFieldData)0x270794,pTVar30,
                             (uint64_t)f);
        return pcVar29;
      case 8:
switchD_001d19c0_caseD_8:
        pcVar29 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)0>
                            ((MessageLite *)msg_00,pcVar29,pPVar20,(TcFieldData)0x270794,pTVar30,
                             (uint64_t)f);
        return pcVar29;
      case 9:
switchD_001d19c0_caseD_9:
        pcVar29 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                            ((MessageLite *)msg_00,pcVar29,pPVar20,(TcFieldData)0x270794,pTVar30,
                             (uint64_t)f);
        return pcVar29;
      case 10:
switchD_001d19c0_caseD_a:
        *piVar15 = *piVar15 + (int)piVar15;
        msg_00 = (ParseContext *)(ulong)((uint)((ulong)msg_00 >> 9) & 3);
code_r0x001d54a2:
        pcVar29 = (char *)(*(code *)((long)&switchD_001d54b0::switchdataD_002707bc +
                                    (long)(int)(&switchD_001d54b0::switchdataD_002707bc)
                                               [(long)msg_00]))();
        return pcVar29;
      case 0xb:
        goto switchD_001d19c0_caseD_b;
      case 0xc:
switchD_001d19c0_caseD_c:
        pcVar29 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
        ;
        paVar28 = paVar27;
        goto switchD_001d19c0_caseD_b;
      case 0xd:
switchD_001d19c0_caseD_d:
        lVar16 = CONCAT71((int7)((ulong)piVar15 >> 8),(char)piVar15 + '\a');
        pcVar29 = (char *)(lVar16 + -0x7cf6103f);
        *pcVar29 = *pcVar29 + (char)pPVar20 + -0x12;
        out(3,(int)lVar16);
        goto code_r0x001d54a2;
      case 0xe:
switchD_001d19c0_caseD_e:
        return (char *)piVar15;
      case 0xf:
switchD_001d19c0_caseD_f:
        return (char *)piVar15;
      }
    }
    else {
      paVar25[-1].node = (NodeBase **)0x1d1975;
      puVar19 = (uint *)UntypedMapBase::GetValue<int>(f,(NodeBase *)node);
      uVar12 = *puVar19;
      pNVar8 = paVar25[2].node[1];
      pcVar29 = (char *)(long)(short)*(uint *)&pNVar8->next;
      msg_00 = (ParseContext *)(ulong)(*(uint *)&pNVar8->next >> 0x10);
      pPVar20 = (ParseContext *)(((long)(int)uVar12 - (long)pcVar29) - (long)msg_00);
      if ((ParseContext *)((long)(int)uVar12 - (long)pcVar29) < msg_00) goto LAB_001d199b;
      uVar5 = *(uint *)((long)&pNVar8->next + 4);
      pcVar29 = (char *)(ulong)uVar5;
      msg_00 = (ParseContext *)(ulong)(ushort)uVar5;
      if (msg_00 <= pPVar20) {
        pPVar20 = (ParseContext *)(ulong)(uVar5 >> 0x10);
        pcVar29 = (char *)0x0;
        do {
          if (pPVar20 <= pcVar29) goto LAB_001d1a4f;
          uVar6 = *(uint *)((long)&pNVar8[1].next + (long)pcVar29 * 4 + (ulong)(uVar5 >> 3 & 0x1ffc)
                           );
          msg_00 = (ParseContext *)(ulong)uVar6;
          pTVar30 = (TcParseTableBase *)(ulong)((int)uVar12 < (int)uVar6);
          pcVar29 = (char *)(((long)pcVar29 * 2 - (long)pTVar30) + 2);
        } while (uVar6 != uVar12);
        goto LAB_001d199b;
      }
      if ((*(uint *)((long)&pNVar8[1].next + ((ulong)pPVar20 >> 5) * 4) >> ((uint)pPVar20 & 0x1f) &
          1) != 0) goto LAB_001d199b;
LAB_001d1a4f:
      pTVar30 = (TcParseTableBase *)paVar25[1].f;
      puVar19 = (uint *)((ulong)pUVar7 & 0xffffffff);
      pUVar7 = paVar25[5].this;
      paVar25[-1].node = (NodeBase **)0x1d1a6c;
      WriteMapEntryAsUnknown
                ((MessageLite *)paVar25[1].node,pTVar30,f,uVar13,(NodeBase *)node,SUB85(pUVar7,0));
    }
    if ((ctx_00->super_EpsCopyInputStream).limit_end_ <= puVar14) {
      uVar3 = **(ushort **)((long)paVar21 + 0x20);
      if ((ulong)uVar3 != 0) {
        *(undefined8 *)((long)paVar21 + -8) = 0x1d1b98;
        puVar19 = RefAt<unsigned_int>(*(void **)((long)paVar21 + 0x28),(ulong)uVar3);
        *puVar19 = *puVar19 | (uint)*(undefined8 *)((long)paVar21 + 0x38);
      }
      return (char *)puVar14;
    }
    bVar1 = (byte)*puVar14;
    uVar12 = (uint)bVar1;
    ptr = (char *)((long)puVar14 + 1);
    if ((char)bVar1 < '\0') {
      uVar18 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
      bVar2 = *(byte *)&(((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                           *)ptr)->super_anon_class_8_1_ba1d60bc).map;
      lVar16 = CONCAT71(uVar18,bVar2);
      if ((char)bVar2 < '\0') {
        uVar18 = uVar18 >> 7 | (uint7)((ulong)(lVar16 << 0x39) >> 8);
        lVar16 = CONCAT71(uVar18,(byte)puVar14[1]);
        if ((char)(byte)puVar14[1] < '\0') {
          uVar18 = uVar18 >> 7 | (uint7)((ulong)(lVar16 << 0x39) >> 8);
          lVar16 = CONCAT71(uVar18,*(byte *)((long)puVar14 + 3));
          if ((char)*(byte *)((long)puVar14 + 3) < '\0') {
            uVar18 = uVar18 >> 7 | (uint7)((ulong)(lVar16 << 0x39) >> 8);
            if ((char)(byte)puVar14[2] < '\0') {
              uVar12 = 0;
              ptr = (char *)0x0;
            }
            else {
              uVar12 = (int)CONCAT71(uVar18,(byte)puVar14[2]) << 0x1c | (uint)(uVar18 >> 0x1c);
              ptr = (char *)((long)puVar14 + 5);
            }
          }
          else {
            uVar12 = (int)lVar16 << 0x15 | (uint)(uVar18 >> 0x23);
            ptr = (char *)(puVar14 + 2);
          }
        }
        else {
          uVar12 = (int)lVar16 << 0xe | (uint)(uVar18 >> 0x2a);
          ptr = (char *)((long)puVar14 + 3);
        }
        uVar13 = (uint)*(undefined8 *)((long)paVar21 + 0x30);
      }
      else {
        uVar12 = (int)lVar16 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
        ptr = (char *)(puVar14 + 1);
      }
    }
    paVar25 = paVar21;
    if (uVar12 != uVar13) {
      lVar16 = *(long *)((long)paVar21 + 0x20);
      uVar13 = (uint)*(byte *)(lVar16 + 8) & (uint)*puVar14;
      if ((uVar13 & 7) != 0) {
        *(undefined **)((long)paVar21 + -8) = &UNK_001d1c43;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar17 = (ulong)(uVar13 & 0xfffffff8);
      pcVar29 = (char *)(**(code **)(lVar16 + 0x38 + uVar17 * 2))
                                  (*(undefined8 *)((long)paVar21 + 0x28),puVar14,
                                   *(undefined8 *)((long)paVar21 + 0x68),
                                   (ulong)*puVar14 ^ *(ulong *)(lVar16 + 0x40 + uVar17 * 2),lVar16,
                                   *(undefined8 *)((long)paVar21 + 0x38));
      return pcVar29;
    }
  } while( true );
switchD_001d19c0_caseD_b:
  *(undefined **)((long)paVar28 + -8) = &UNK_001d549b;
  protobuf_assumption_failed((char *)msg_00,pcVar29,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMap(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // `aux[0]` points into a MapAuxInfo.
  // If we have a message mapped_type aux[1] points into a `create_in_arena`.
  // If we have a validated enum mapped_type aux[1] point into a
  // `enum_data`.
  const auto* aux = table->field_aux(&entry);
  const auto map_info = aux[0].map_info;

  if (ABSL_PREDICT_FALSE(!map_info.is_supported ||
                         (data.tag() & 7) !=
                             WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    PROTOBUF_MUSTTAIL return MpFallback(PROTOBUF_TC_PARAM_PASS);
  }

  // When using LITE, the offset points directly into the Map<> object.
  // Otherwise, it points into a MapField and we must synchronize with
  // reflection. It is done by calling the MutableMap() virtual function on the
  // field's base class.
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  UntypedMapBase& map =
      map_info.use_lite
          ? RefAt<UntypedMapBase>(base, entry.offset)
          : *RefAt<MapFieldBaseForParse>(base, entry.offset).MutableMap();

  const uint32_t saved_tag = data.tag();

  while (true) {
    NodeBase* node = map.AllocNode();
    char* const node_end =
        reinterpret_cast<char*>(node) + map.type_info().node_size;
    void* const node_key = node->GetVoidKey();

    // Due to node alignment we can guarantee that we have at least 8 writable
    // bytes from the key position to the end of the node.
    // We can initialize the first and last 8 bytes, which takes care of all the
    // scalar value types. This makes the VisitXXX calls below faster because
    // the switch is much smaller.
    // Assert this in debug mode, just in case.
    ABSL_DCHECK_GE(node_end - static_cast<char*>(node_key), sizeof(uint64_t));
    memset(node_key, 0, sizeof(uint64_t));
    memset(node_end - sizeof(uint64_t), 0, sizeof(uint64_t));

    map.VisitKey(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    map.VisitValue(  //
        node, absl::Overload{
                  [&](std::string* str) {
                    Arena::CreateInArenaStorage(str, map.arena());
                  },
                  [&](MessageLite* msg) {
                    aux[1].table->class_data->PlacementNew(msg, map.arena());
                  },
                  // Already initialized above. Do nothing here.
                  [](void*) {},
              });

    ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
      return ParseOneMapEntry(node, ptr, ctx, aux, table, entry, map);
    });

    if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
      // Parsing failed. Delete the node that we didn't insert.
      if (map.arena() == nullptr) map.DeleteNode(node);
      PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    if (ABSL_PREDICT_FALSE(
            map_info.value_is_validated_enum &&
            !internal::ValidateEnumInlined(*map.GetValue<int32_t>(node),
                                           aux[1].enum_data))) {
      WriteMapEntryAsUnknown(msg, table, map, saved_tag, node, map_info);
    } else {
      // Done parsing the node, insert it.
      switch (map.type_info().key_type_kind()) {
        case UntypedMapBase::TypeKind::kBool:
          static_cast<KeyMapBase<bool>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<bool>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU32:
          static_cast<KeyMapBase<uint32_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint32_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kU64:
          static_cast<KeyMapBase<uint64_t>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<uint64_t>::KeyNode*>(node));
          break;
        case UntypedMapBase::TypeKind::kString:
          static_cast<KeyMapBase<std::string>&>(map).InsertOrReplaceNode(
              static_cast<KeyMapBase<std::string>::KeyNode*>(node));
          break;
        default:
          Unreachable();
      }
    }

    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) {
      PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
    }

    uint32_t next_tag;
    const char* ptr2 = ReadTagInlined(ptr, &next_tag);
    if (next_tag != saved_tag) break;
    ptr = ptr2;
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}